

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall icu_63::LocDataParser::skipWhitespace(LocDataParser *this)

{
  UBool UVar1;
  UChar *pUVar2;
  UChar UVar3;
  
  pUVar2 = this->p;
  while( true ) {
    if (this->e <= pUVar2) {
      return;
    }
    UVar3 = this->ch;
    if (UVar3 == L'\xffff') {
      UVar3 = *pUVar2;
    }
    UVar1 = PatternProps::isWhiteSpace((uint)(ushort)UVar3);
    if (UVar1 == '\0') break;
    pUVar2 = this->p + 1;
    this->p = pUVar2;
    this->ch = L'\xffff';
  }
  return;
}

Assistant:

inline void skipWhitespace(void) {
        while (p < e && PatternProps::isWhiteSpace(ch != 0xffff ? ch : *p)) {
            inc();
        }
    }